

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_sampler_skip.cpp
# Opt level: O1

void kokkosp_begin_parallel_for(char *name,uint32_t devID,uint64_t *kID)

{
  long lVar1;
  int iVar2;
  ostream *poVar3;
  
  lVar1 = KokkosTools::Sampler::uniqID + 1;
  *kID = KokkosTools::Sampler::uniqID;
  KokkosTools::Sampler::uniqID = lVar1;
  KokkosTools::Sampler::kokkosp_begin_parallel_for::invocationNum =
       KokkosTools::Sampler::kokkosp_begin_parallel_for::invocationNum + 1;
  if (((KokkosTools::Sampler::kokkosp_begin_parallel_for::invocationNum %
        KokkosTools::Sampler::kernelSampleSkip == 0) &&
      (iVar2 = rand(), (double)iVar2 / 2147483647.0 < KokkosTools::Sampler::tool_prob_num / 100.0))
     && (KokkosTools::Sampler::beginForCallee != (code *)0x0)) {
    if (0 < KokkosTools::Sampler::tool_verbosity) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"KokkosP: sample ",0x10);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3," calling child-begin function...\n",0x21);
    }
    if (KokkosTools::Sampler::tool_globFence != 0) {
      KokkosTools::Sampler::invoke_ktools_fence(0);
    }
    (*KokkosTools::Sampler::beginForCallee)(name,devID);
    if (0 < KokkosTools::Sampler::tool_verbosity) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"KokkosP: sample ",0x10);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3," finished with child-begin function.\n",0x25);
    }
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_long_const,unsigned_long>>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&KokkosTools::Sampler::infokIDSample);
  }
  return;
}

Assistant:

void kokkosp_begin_parallel_for(const char* name, const uint32_t devID,
                                uint64_t* kID) {
  *kID                          = uniqID++;
  static uint64_t invocationNum = 0;
  ++invocationNum;
  if ((invocationNum % kernelSampleSkip) == 0) {
    if ((rand() / (1.0 * RAND_MAX)) < (tool_prob_num / 100.0)) {
      if (NULL != beginForCallee) {
        if (tool_verbosity > 0) {
          std::cout << "KokkosP: sample " << *kID
                    << " calling child-begin function...\n";
        }
        if (tool_globFence) {
          invoke_ktools_fence(0);
        }
        uint64_t nestedkID = 0;
        (*beginForCallee)(name, devID, &nestedkID);
        if (tool_verbosity > 0) {
          std::cout << "KokkosP: sample " << *kID
                    << " finished with child-begin function.\n";
        }
        infokIDSample.insert({*kID, nestedkID});
      }
    }
  }
}